

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall QTextBrowser::doSetSource(QTextBrowser *this,QUrl *url,ResourceType type)

{
  bool bVar1;
  QTextBrowserPrivate *this_00;
  ulong uVar2;
  QTextBrowserPrivate *in_RSI;
  HistoryEntry *in_RDI;
  long in_FS_OFFSET;
  QTextBrowserPrivate *d;
  HistoryEntry entry;
  HistoryEntry historyEntry;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar4;
  QUrl local_78 [4];
  undefined4 local_58;
  undefined4 local_54;
  ResourceType local_48;
  undefined1 local_40 [44];
  ResourceType in_stack_ffffffffffffffec;
  QUrl *in_stack_fffffffffffffff0;
  QTextBrowserPrivate *this_01;
  
  this_01 = *(QTextBrowserPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextBrowser *)0x6de918);
  memset(local_40,0xaa,0x38);
  QTextBrowserPrivate::createHistoryEntry(in_RSI);
  QTextBrowserPrivate::setSource(this_01,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  uVar2 = QUrl::isValid();
  if ((uVar2 & 1) == 0) {
    uVar4 = 1;
    goto LAB_006deb78;
  }
  bVar1 = QList<QTextBrowserPrivate::HistoryEntry>::isEmpty
                    ((QList<QTextBrowserPrivate::HistoryEntry> *)0x6de985);
  if (!bVar1) {
    QStack<QTextBrowserPrivate::HistoryEntry>::top
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)0x6de99a);
    bVar1 = ::operator==((QUrl *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         &in_RDI->url);
    if (bVar1) {
      uVar4 = 1;
      goto LAB_006deb78;
    }
  }
  bVar1 = QList<QTextBrowserPrivate::HistoryEntry>::isEmpty
                    ((QList<QTextBrowserPrivate::HistoryEntry> *)0x6de9cb);
  if (!bVar1) {
    QStack<QTextBrowserPrivate::HistoryEntry>::top
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)0x6de9e0);
    QTextBrowserPrivate::HistoryEntry::operator=
              ((HistoryEntry *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RDI)
    ;
  }
  memset(local_78,0xaa,0x38);
  QTextBrowserPrivate::HistoryEntry::HistoryEntry
            ((HistoryEntry *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  QUrl::operator=(local_78,(QUrl *)in_RSI);
  local_48 = this_00->currentType;
  QTextEdit::documentTitle((QTextEdit *)this_00);
  QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (QString *)in_RDI);
  QString::~QString((QString *)0x6dea66);
  local_58 = 0;
  local_54 = 0;
  QStack<QTextBrowserPrivate::HistoryEntry>::push
            ((QStack<QTextBrowserPrivate::HistoryEntry> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RDI);
  QList<QTextBrowserPrivate::HistoryEntry>::size
            (&(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>);
  backwardAvailable((QTextBrowser *)0x6deabc,SUB81((ulong)in_RDI >> 0x38,0));
  bVar1 = QList<QTextBrowserPrivate::HistoryEntry>::isEmpty
                    ((QList<QTextBrowserPrivate::HistoryEntry> *)0x6deacd);
  if (bVar1) {
LAB_006deb3e:
    uVar3 = (undefined1)((ulong)in_RDI >> 0x38);
    QList<QTextBrowserPrivate::HistoryEntry>::clear
              ((QList<QTextBrowserPrivate::HistoryEntry> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    forwardAvailable((QTextBrowser *)0x6deb5a,(bool)uVar3);
  }
  else {
    QStack<QTextBrowserPrivate::HistoryEntry>::top
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)0x6deae2);
    bVar1 = ::operator==((QUrl *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         &in_RDI->url);
    if (!bVar1) goto LAB_006deb3e;
    QStack<QTextBrowserPrivate::HistoryEntry>::pop
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)in_RDI);
    uVar3 = (undefined1)((ulong)in_RDI >> 0x38);
    QTextBrowserPrivate::HistoryEntry::~HistoryEntry
              ((HistoryEntry *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    QList<QTextBrowserPrivate::HistoryEntry>::size
              (&(this_00->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>);
    forwardAvailable((QTextBrowser *)0x6deb3c,(bool)uVar3);
  }
  historyChanged((QTextBrowser *)0x6deb63);
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry
            ((HistoryEntry *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  uVar4 = 0;
LAB_006deb78:
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry
            ((HistoryEntry *)CONCAT44(uVar4,in_stack_ffffffffffffff10));
  if (*(QTextBrowserPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextBrowser::doSetSource(const QUrl &url, QTextDocument::ResourceType type)
{
    Q_D(QTextBrowser);

    const QTextBrowserPrivate::HistoryEntry historyEntry = d->createHistoryEntry();

    d->setSource(url, type);

    if (!url.isValid())
        return;

    // the same url you are already watching?
    if (!d->stack.isEmpty() && d->stack.top().url == url)
        return;

    if (!d->stack.isEmpty())
        d->stack.top() = historyEntry;

    QTextBrowserPrivate::HistoryEntry entry;
    entry.url = url;
    entry.type = d->currentType;
    entry.title = documentTitle();
    entry.hpos = 0;
    entry.vpos = 0;
    d->stack.push(entry);

    emit backwardAvailable(d->stack.size() > 1);

    if (!d->forwardStack.isEmpty() && d->forwardStack.top().url == url) {
        d->forwardStack.pop();
        emit forwardAvailable(d->forwardStack.size() > 0);
    } else {
        d->forwardStack.clear();
        emit forwardAvailable(false);
    }

    emit historyChanged();
}